

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int init_declarator(sym_t *s)

{
  int iVar1;
  socklen_t *__addr_len;
  sockaddr *in_RSI;
  long in_RDI;
  sym_t *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = declarator(in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = accept(0x3d,in_RSI,__addr_len);
    if (iVar1 != 0) {
      iVar1 = initializer((sym_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        err(E,"expected expression after \'=\'");
      }
      else if (*(int *)(in_RDI + 0x24) != 0) {
        err(E,"function \'%s\' declared like a variable",in_RDI);
      }
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int init_declarator(sym_t* s)
{
    if (declarator(s))
    {
        if (accept('='))
        {
            if (initializer(s))
            {
                if (s->function)
                    err(E, "function '%s' declared like a variable", s->id);
            }
            else
                err(E, "expected expression after '='");
        }
        return 1;
    }
    return 0;
}